

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscribedsignal.cpp
# Opt level: O0

void __thiscall
hbm::streaming::SubscribedSignal::processSignalMetaInformation
          (SubscribedSignal *this,string *method,Value *params)

{
  bool bVar1;
  ostream *poVar2;
  StyledWriter *this_00;
  size_t in_RCX;
  void *in_RDX;
  string *in_RSI;
  long in_RDI;
  ArrayIndex in_stack_00000064;
  Value *in_stack_00000068;
  Value *in_stack_00000088;
  runtime_error *e;
  deltaTimeInfo *in_stack_000000c0;
  Value *in_stack_fffffffffffffe68;
  StyledWriter *in_stack_fffffffffffffe70;
  undefined1 local_170 [112];
  StyledWriter local_100;
  Value *in_stack_ffffffffffffff78;
  SubscribedSignal *in_stack_ffffffffffffff80;
  undefined1 local_58 [72];
  string *local_10;
  
  local_58._64_8_ = in_RDX;
  local_10 = in_RSI;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
  if (bVar1) {
    bVar1 = Json::Value::empty(in_stack_fffffffffffffe68);
    if (!bVar1) {
      Json::Value::operator[](in_stack_00000068,in_stack_00000064);
      Json::Value::asString_abi_cxx11_(in_stack_00000088);
      std::__cxx11::string::operator=((string *)(in_RDI + 8),(string *)(local_58 + 0x20));
      std::__cxx11::string::~string((string *)(local_58 + 0x20));
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
    if (bVar1) {
      deltaTimeInfo::setTime((deltaTimeInfo *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
      if (bVar1) {
        setDataFormat(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
        if (bVar1) {
          Json::StyledWriter::StyledWriter(in_stack_fffffffffffffe70);
          Json::StyledWriter::write_abi_cxx11_
                    ((StyledWriter *)local_58,(int)&local_100 + 0x38,(void *)local_58._64_8_,in_RCX)
          ;
          poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_58);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_58);
          Json::StyledWriter::~StyledWriter(in_stack_fffffffffffffe70);
          deltaTimeInfo::setDelta(in_stack_000000c0,(Value *)e);
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "unhandled signal related meta information \'");
          poVar2 = std::operator<<(poVar2,local_10);
          poVar2 = std::operator<<(poVar2,"\' for signal ");
          poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 8));
          this_00 = (StyledWriter *)std::operator<<(poVar2," with parameters: ");
          Json::StyledWriter::StyledWriter(this_00);
          Json::StyledWriter::write_abi_cxx11_
                    (&local_100,(int)local_170,(void *)local_58._64_8_,in_RCX);
          poVar2 = std::operator<<((ostream *)this_00,(string *)&local_100);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_100);
          Json::StyledWriter::~StyledWriter(this_00);
        }
      }
    }
  }
  return;
}

Assistant:

void SubscribedSignal::processSignalMetaInformation(const std::string& method, const Json::Value& params)
		{
			if(method=="subscribe") {
				/// this is the first signal related meta information to arrive!
				if(params.empty()==false) {
					m_signalReference = params[0u].asString();
				}
			} else if(method=="time") {
				m_syncSignalTime.setTime(params);
			} else if(method=="data") {
				setDataFormat(params);
			} else if(method=="signalRate") {
				try {
					std::cout << Json::StyledWriter().write(params) << std::endl;
					m_syncSignalTime.setDelta(params);
				} catch(const std::runtime_error& e) {
					std::cerr << e.what();
				}
			} else {
				std::cout << "unhandled signal related meta information '" << method << "' for signal " << m_signalReference << " with parameters: " << Json::StyledWriter().write(params) << std::endl;
			}
		}